

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcComms.cpp
# Opt level: O3

void __thiscall helics::ipc::IpcComms::queue_rx_function(IpcComms *this)

{
  function<void_(helics::ActionMessage_&&)> *pfVar1;
  ulong uVar2;
  _Alloc_hider _Var3;
  int iVar4;
  int *piVar5;
  int __fd;
  long lVar6;
  ActionMessage err;
  OwnedQueue rxQueue;
  ActionMessage local_1a8;
  char local_f0;
  OwnedQueue local_e8;
  
  local_e8.connectionNameOrig._M_dataplus._M_p = (pointer)&local_e8.connectionNameOrig.field_2;
  local_e8.rqueue._M_t.
  super___uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  .
  super__Head_base<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>,_true,_true>
        )(__uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
          )0x0;
  local_e8.queue_state._M_t.
  super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
  ._M_t.
  super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
  .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>._M_head_impl =
       (__uniq_ptr_data<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>,_true,_true>
        )(__uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
          )0x0;
  local_e8.connectionNameOrig._M_string_length = 0;
  local_e8.connectionNameOrig.field_2._M_local_buf[0] = '\0';
  local_e8.connectionName._M_dataplus._M_p = (pointer)&local_e8.connectionName.field_2;
  local_e8.connectionName._M_string_length = 0;
  local_e8.connectionName.field_2._M_local_buf[0] = '\0';
  local_e8.stateName._M_dataplus._M_p = (pointer)&local_e8.stateName.field_2;
  local_e8.stateName._M_string_length = 0;
  local_e8.stateName.field_2._M_local_buf[0] = '\0';
  local_e8.errorString._M_dataplus._M_p = (pointer)&local_e8.errorString.field_2;
  local_e8.errorString._M_string_length = 0;
  local_e8.errorString.field_2._M_local_buf[0] = '\0';
  local_e8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_5_ = 0;
  local_e8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._5_3_ = 0;
  local_e8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_5_ = 0;
  local_e8._165_8_ = 0;
  __fd = (int)this + 0xf0;
  iVar4 = OwnedQueue::connect(&local_e8,__fd,
                              (sockaddr *)(ulong)(uint)(this->super_CommsInterface).maxMessageCount,
                              (this->super_CommsInterface).maxMessageSize);
  if ((char)iVar4 == '\0') {
    uVar2 = (this->super_CommsInterface).connectionTimeout.__r;
    if (0 < (long)uVar2) {
      local_1a8._0_8_ = uVar2 / 1000;
      local_1a8._8_8_ = (uVar2 % 1000) * 1000000;
      do {
        iVar4 = nanosleep((timespec *)&local_1a8,(timespec *)&local_1a8);
        if (iVar4 != -1) break;
        piVar5 = __errno_location();
      } while (*piVar5 == 4);
    }
    iVar4 = OwnedQueue::connect(&local_e8,__fd,
                                (sockaddr *)
                                (ulong)(uint)(this->super_CommsInterface).maxMessageCount,
                                (this->super_CommsInterface).maxMessageSize);
    if ((char)iVar4 != '\0') goto LAB_0025b079;
    LOCK();
    (this->super_CommsInterface).disconnecting._M_base._M_i = true;
    UNLOCK();
    ActionMessage::ActionMessage(&local_1a8,cmd_error);
    local_1a8.payload.bufferSize = local_e8.errorString._M_string_length;
    _Var3._M_p = local_e8.errorString._M_dataplus._M_p;
    local_1a8.messageID = 0xfffffffe;
    if ((byte *)local_e8.errorString._M_dataplus._M_p == local_1a8.payload.heap) {
    }
    else {
      SmallBuffer::reserve(&local_1a8.payload,local_e8.errorString._M_string_length);
      if (local_1a8.payload.bufferSize != 0) {
        memcpy(local_1a8.payload.heap,_Var3._M_p,local_1a8.payload.bufferSize);
      }
    }
    if ((this->super_CommsInterface).ActionCallback.super__Function_base._M_manager ==
        (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->super_CommsInterface).ActionCallback._M_invoker)
              ((_Any_data *)&(this->super_CommsInterface).ActionCallback,&local_1a8);
    CommsInterface::setRxStatus(&this->super_CommsInterface,ERRORED);
    OwnedQueue::changeState(&local_e8,closing);
LAB_0025b359:
    ActionMessage::~ActionMessage(&local_1a8);
LAB_0025b363:
    OwnedQueue::~OwnedQueue(&local_e8);
    return;
  }
LAB_0025b079:
  CommsInterface::setRxStatus(&this->super_CommsInterface,CONNECTED);
  pfVar1 = &(this->super_CommsInterface).ActionCallback;
  iVar4 = (this->ipcbackchannel).super___atomic_base<int>._M_i;
  if (iVar4 == 2) {
    iVar4 = OwnedQueue::connect(&local_e8,__fd,
                                (sockaddr *)
                                (ulong)(uint)(this->super_CommsInterface).maxMessageCount,
                                (this->super_CommsInterface).maxMessageSize);
    if ((char)iVar4 == '\0') {
      LOCK();
      (this->super_CommsInterface).disconnecting._M_base._M_i = true;
      UNLOCK();
      ActionMessage::ActionMessage(&local_1a8,cmd_error);
      local_1a8.payload.bufferSize = local_e8.errorString._M_string_length;
      _Var3._M_p = local_e8.errorString._M_dataplus._M_p;
      local_1a8.messageID = 0xfffffffe;
      if ((byte *)local_e8.errorString._M_dataplus._M_p == local_1a8.payload.heap) {
      }
      else {
        SmallBuffer::reserve(&local_1a8.payload,local_e8.errorString._M_string_length);
        if (local_1a8.payload.bufferSize != 0) {
          memcpy(local_1a8.payload.heap,_Var3._M_p,local_1a8.payload.bufferSize);
        }
      }
      if ((this->super_CommsInterface).ActionCallback.super__Function_base._M_manager ==
          (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->super_CommsInterface).ActionCallback._M_invoker)((_Any_data *)pfVar1,&local_1a8);
      CommsInterface::setRxStatus(&this->super_CommsInterface,ERRORED);
      OwnedQueue::changeState(&local_e8,closing);
      LOCK();
      (this->ipcbackchannel).super___atomic_base<int>._M_i = 0;
      UNLOCK();
      goto LAB_0025b359;
    }
    LOCK();
    (this->ipcbackchannel).super___atomic_base<int>._M_i = 0;
    UNLOCK();
  }
  else if (iVar4 == 4) {
    LOCK();
    (this->ipcbackchannel).super___atomic_base<int>._M_i = 0;
    UNLOCK();
    OwnedQueue::changeState(&local_e8,closing);
    CommsInterface::setRxStatus(&this->super_CommsInterface,TERMINATED);
    goto LAB_0025b363;
  }
  OwnedQueue::getMessage((optional<helics::ActionMessage> *)&local_1a8,&local_e8,2000);
  lVar6 = 4;
  if (local_f0 == '\0') goto LAB_0025b19b;
  if (local_1a8.messageAction < cmd_protocol) {
    if (local_1a8.messageAction == cmd_protocol_priority) {
LAB_0025b143:
      if (local_1a8.messageID == 0x20fc7) {
        OwnedQueue::changeState(&local_e8,operating);
      }
      else if (local_1a8.messageID == 0x16570bf) {
        LOCK();
        (this->super_CommsInterface).disconnecting._M_base._M_i = true;
        UNLOCK();
        lVar6 = 5;
      }
      goto LAB_0025b19b;
    }
    if (local_1a8.messageAction == cmd_init_grant) {
      OwnedQueue::changeState(&local_e8,operating);
    }
  }
  else if ((local_1a8.messageAction == cmd_protocol_big) ||
          (local_1a8.messageAction == cmd_protocol)) goto LAB_0025b143;
  if ((this->super_CommsInterface).ActionCallback.super__Function_base._M_manager ==
      (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  lVar6 = 0;
  (*(this->super_CommsInterface).ActionCallback._M_invoker)((_Any_data *)pfVar1,&local_1a8);
LAB_0025b19b:
  if (local_f0 == '\x01') {
    local_f0 = '\0';
    ActionMessage::~ActionMessage(&local_1a8);
  }
  (*(code *)((long)&DAT_003da230 + (long)(int)(&DAT_003da230)[lVar6]))();
  return;
}

Assistant:

void IpcComms::queue_rx_function()
    {
        OwnedQueue rxQueue;
        bool connected = rxQueue.connect(localTargetAddress, maxMessageCount, maxMessageSize);
        while (!connected) {
            std::this_thread::sleep_for(connectionTimeout);
            connected = rxQueue.connect(localTargetAddress, maxMessageCount, maxMessageSize);
            if (!connected) {
                disconnecting = true;
                ActionMessage err(CMD_ERROR);
                err.messageID = defs::Errors::CONNECTION_FAILURE;
                err.payload = rxQueue.getError();
                ActionCallback(std::move(err));
                setRxStatus(ConnectionStatus::ERRORED);  // the connection has failed
                rxQueue.changeState(queue_state_t::closing);
                return;
            }
        }
        setRxStatus(
            ConnectionStatus::CONNECTED);  // this is a atomic indicator that the rx queue is ready
        bool IPCoperating = false;
        while (true) {
            auto bc = ipcbackchannel.load();

            switch (bc) {
                case IPC_BACKCHANNEL_DISCONNECT:
                    ipcbackchannel = 0;
                    goto DISCONNECT_RX_QUEUE;
                case IPC_BACKCHANNEL_TRY_RESET:
                    connected =
                        rxQueue.connect(localTargetAddress, maxMessageCount, maxMessageSize);
                    if (!connected) {
                        disconnecting = true;
                        ActionMessage err(CMD_ERROR);
                        err.messageID = defs::Errors::CONNECTION_FAILURE;
                        err.payload = rxQueue.getError();
                        ActionCallback(std::move(err));
                        setRxStatus(ConnectionStatus::ERRORED);  // the connection has failed
                        rxQueue.changeState(queue_state_t::closing);
                        ipcbackchannel = 0;
                        return;
                    }
                    ipcbackchannel = 0;
                    break;
                default:
                    break;
            }
            auto cmdopt = rxQueue.getMessage(2000);
            if (!cmdopt) {
                continue;
            }
            if (isProtocolCommand(*cmdopt)) {
                if (cmdopt->messageID == CLOSE_RECEIVER) {
                    disconnecting = true;
                    break;
                }
                if (cmdopt->messageID == SET_TO_OPERATING) {
                    if (!IPCoperating) {
                        rxQueue.changeState(queue_state_t::operating);
                        IPCoperating = true;
                    }
                }
                continue;
            }
            if (cmdopt->action() == CMD_INIT_GRANT) {
                if (!IPCoperating) {
                    rxQueue.changeState(queue_state_t::operating);
                    IPCoperating = true;
                }
            }
            ActionCallback(std::move(*cmdopt));
        }
    DISCONNECT_RX_QUEUE:
        try {
            rxQueue.changeState(queue_state_t::closing);
        }
        catch (boost::interprocess::interprocess_exception const& ipe) {
            logError(std::string("error changing states:") + ipe.what());
        }
        setRxStatus(ConnectionStatus::TERMINATED);
    }